

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# workerThread.cpp
# Opt level: O0

void __thiscall WorkerThread::WorkerThread(WorkerThread *this,WorkerThread *wt)

{
  long in_RSI;
  thread *in_RDI;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaf;
  thread *this_00;
  condition_variable *this_01;
  packaged_task<void_()> *this_02;
  type *in_stack_ffffffffffffffd8;
  
  this_00 = in_RDI;
  std::thread::thread((thread *)0x11d4e5);
  this_02 = (packaged_task<void_()> *)(in_RDI + 1);
  std::packaged_task<void_()>::packaged_task((packaged_task<void_()> *)0x11d4f8);
  std::mutex::mutex((mutex *)0x11d506);
  this_01 = (condition_variable *)(in_RDI + 9);
  std::condition_variable::condition_variable(this_01);
  std::atomic<bool>::operator=((atomic<bool> *)this_00,(bool)in_stack_ffffffffffffffaf);
  std::packaged_task<void_()>::operator=(this_02,(packaged_task<void_()> *)this_01);
  *(byte *)&in_RDI[3]._M_id._M_thread = *(byte *)(in_RSI + 0x18) & 1;
  std::thread::thread<WorkerThread::WorkerThread(WorkerThread&&)::__0,,void>
            (in_RDI,in_stack_ffffffffffffffd8);
  std::thread::operator=
            (this_00,(thread *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
  std::thread::~thread((thread *)0x11d57e);
  return;
}

Assistant:

WorkerThread::WorkerThread (WorkerThread&& wt) {
	stopMe			= false;
	task			= std::move(wt.task);
	taskPresence	= wt.taskPresence;
	workerThread	= std::thread ([&] {
		workerFunction ();
	});
}